

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcUtil.c
# Opt level: O0

void Abc_NtkReverseTopoOrder(Abc_Ntk_t *p)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  Vec_Int_t *pVVar5;
  Abc_Obj_t *pObj_00;
  int local_1c;
  int i;
  Abc_Obj_t *pObj;
  Abc_Ntk_t *p_local;
  
  if (p->vTopo == (Vec_Int_t *)0x0) {
    iVar1 = Abc_NtkObjNumMax(p);
    pVVar5 = Vec_IntAlloc(iVar1 * 10);
    p->vTopo = pVVar5;
    pVVar5 = p->vTopo;
    iVar1 = Abc_NtkObjNumMax(p);
    Vec_IntFill(pVVar5,iVar1 << 1,0);
    for (local_1c = 0; iVar1 = Vec_PtrSize(p->vObjs), local_1c < iVar1; local_1c = local_1c + 1) {
      pObj_00 = Abc_NtkObj(p,local_1c);
      if (((pObj_00 != (Abc_Obj_t *)0x0) && (iVar1 = Abc_ObjIsNode(pObj_00), iVar1 != 0)) &&
         (iVar1 = Abc_NtkTopoHasBeg(pObj_00), iVar1 == 0)) {
        Abc_NtkIncrementTravId(p);
        Abc_NtkReverseTopoOrder_rec(pObj_00,1);
      }
    }
    uVar2 = Abc_NtkNodeNum(p);
    uVar3 = Vec_IntSize(p->vTopo);
    iVar1 = Vec_IntSize(p->vTopo);
    iVar4 = Abc_NtkNodeNum(p);
    printf("Nodes = %d.   Size = %d.  Ratio = %f.\n",((double)iVar1 * 1.0) / (double)iVar4,
           (ulong)uVar2,(ulong)uVar3);
    return;
  }
  __assert_fail("p->vTopo == NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcUtil.c"
                ,0xa46,"void Abc_NtkReverseTopoOrder(Abc_Ntk_t *)");
}

Assistant:

void Abc_NtkReverseTopoOrder( Abc_Ntk_t * p )
{
    Abc_Obj_t * pObj;
    int i;
    assert( p->vTopo == NULL );
    p->vTopo = Vec_IntAlloc( 10 * Abc_NtkObjNumMax(p) );
    Vec_IntFill( p->vTopo, 2 * Abc_NtkObjNumMax(p), 0 );
    Abc_NtkForEachNode( p, pObj, i )
    {
        if ( Abc_NtkTopoHasBeg(pObj) )
            continue;
        Abc_NtkIncrementTravId( p );        
        Abc_NtkReverseTopoOrder_rec( pObj, 1 );
    }
    printf( "Nodes = %d.   Size = %d.  Ratio = %f.\n", 
        Abc_NtkNodeNum(p), Vec_IntSize(p->vTopo), 1.0*Vec_IntSize(p->vTopo)/Abc_NtkNodeNum(p) );
}